

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::withLoc<wasm::Ok>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          Result<wasm::Ok> *res)

{
  ulong pos_00;
  string local_70;
  Err local_50;
  string *local_30;
  Err *err;
  Result<wasm::Ok> *res_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  err = (Err *)res;
  res_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  local_30 = (string *)Result<wasm::Ok>::getErr(res);
  if (local_30 == (string *)0x0) {
    Result<wasm::Ok>::Result(__return_storage_ptr__,res);
  }
  else {
    pos_00 = (ulong)res_local._4_4_;
    std::__cxx11::string::string((string *)&local_70,local_30);
    Lexer::err(&local_50,&this->in,pos_00,&local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<T> withLoc(Index pos, Result<T> res) {
    if (auto err = res.getErr()) {
      return in.err(pos, err->msg);
    }
    return res;
  }